

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# properties.cpp
# Opt level: O0

bool wasm::Properties::isValidConstantExpression(Module *wasm,Expression *expr)

{
  undefined1 local_f8 [8];
  Walker walker;
  Expression *expr_local;
  Module *wasm_local;
  
  walker._216_8_ = expr;
  isValidConstantExpression::Walker::Walker((Walker *)local_f8);
  Walker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>::setModule
            ((Walker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_> *)local_f8,wasm);
  Walker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>::walk
            ((Walker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_> *)local_f8,
             (Expression **)&walker.valid);
  isValidConstantExpression::Walker::~Walker((Walker *)local_f8);
  return (bool)((byte)walker.super_PostWalker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>
                      .super_Walker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>.
                      currModule & 1);
}

Assistant:

bool isValidConstantExpression(Module& wasm, Expression* expr) {
  struct Walker : public PostWalker<Walker, UnifiedExpressionVisitor<Walker>> {
    bool valid = true;
    void visitExpression(Expression* curr) {
      if (!isValidInConstantExpression(*getModule(), curr)) {
        valid = false;
      }
    }
  } walker;
  walker.setModule(&wasm);
  walker.walk(expr);
  return walker.valid;
}